

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void invalid_get_byoffset_test(void)

{
  uint64_t uVar1;
  fdb_status fVar2;
  int iVar3;
  size_t sVar4;
  fdb_kvs_handle *pfVar5;
  FILE *__stream;
  ssize_t sVar6;
  fdb_kvs_handle *in_stack_ffffffffffffea48;
  undefined7 in_stack_ffffffffffffea50;
  fdb_isolation_level_t in_stack_ffffffffffffea57;
  fdb_file_handle *in_stack_ffffffffffffea58;
  fdb_commit_opt_t in_stack_ffffffffffffea67;
  fdb_file_handle *in_stack_ffffffffffffea68;
  void *in_stack_ffffffffffffea70;
  size_t in_stack_ffffffffffffea78;
  void *pvVar7;
  void *pvVar8;
  fdb_kvs_handle *in_stack_ffffffffffffea98;
  fdb_doc *in_stack_ffffffffffffeaa0;
  fdb_kvs_handle *in_stack_ffffffffffffeaa8;
  fdb_doc *in_stack_ffffffffffffeab0;
  fdb_doc *doc_00;
  fdb_kvs_handle *in_stack_ffffffffffffeab8;
  fdb_kvs_handle *handle;
  size_t in_stack_ffffffffffffeac0;
  fdb_doc *in_stack_ffffffffffffeb00;
  ulong local_14e0;
  size_t i_1;
  int64_t offset;
  FILE *fd;
  uint8_t buf [4096];
  uint64_t last_offset;
  int i;
  fdb_doc **doc;
  undefined1 local_490 [248];
  undefined1 local_398 [8];
  char bodybuf [256];
  char keybuf [256];
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fdb_doc *pfStack_78;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int r;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  memcpy(&kvs_config.custom_cmp_param,local_490,0xf8);
  fdb_get_default_kvs_config();
  fVar2 = fdb_open((fdb_file_handle **)buf._392_8_,(char *)buf._384_8_,(fdb_config *)buf._376_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x11c6);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x11c6,"void invalid_get_byoffset_test()");
    }
  }
  fVar2 = fdb_kvs_open((fdb_file_handle *)buf._280_8_,(fdb_kvs_handle **)buf._272_8_,
                       (char *)buf._264_8_,(fdb_kvs_config *)buf._256_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x11c8);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x11c8,"void invalid_get_byoffset_test()");
    }
  }
  fdb_set_log_callback((fdb_kvs_handle *)rdoc,functional_test_dummy_cb,(void *)0x0);
  sprintf(bodybuf + 0xf8,"key");
  sprintf(local_398,"body");
  pfVar5 = (fdb_kvs_handle *)(bodybuf + 0xf8);
  strlen(bodybuf + 0xf8);
  pvVar7 = (void *)0x11d52f;
  sVar4 = strlen(local_398);
  fdb_doc_create((fdb_doc **)in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0,
                 (size_t)in_stack_ffffffffffffea98,pvVar7,sVar4,(void *)0x11d55d,
                 in_stack_ffffffffffffeac0);
  fVar2 = fdb_set((fdb_kvs_handle *)rdoc,pfStack_78);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x11d6);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x11d6,"void invalid_get_byoffset_test()");
    }
  }
  fdb_kvs_close(in_stack_ffffffffffffea98);
  fdb_close((fdb_file_handle *)in_stack_ffffffffffffea98);
  fVar2 = fdb_open((fdb_file_handle **)buf._392_8_,(char *)buf._384_8_,(fdb_config *)buf._376_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x11de);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x11de,"void invalid_get_byoffset_test()");
    }
  }
  fVar2 = fdb_kvs_open((fdb_file_handle *)buf._280_8_,(fdb_kvs_handle **)buf._272_8_,
                       (char *)buf._264_8_,(fdb_kvs_config *)buf._256_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x11e0);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x11e0,"void invalid_get_byoffset_test()");
    }
  }
  fdb_set_log_callback((fdb_kvs_handle *)rdoc,functional_test_dummy_cb,(void *)0x0);
  fVar2 = fdb_get_byoffset(pfVar5,in_stack_ffffffffffffeb00);
  if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x11e7);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) {
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x11e7,"void invalid_get_byoffset_test()");
    }
  }
  fdb_doc_free((fdb_doc *)0x11d759);
  strlen(bodybuf + 0xf8);
  pvVar8 = (void *)0x11d794;
  pfVar5 = (fdb_kvs_handle *)strlen(local_398);
  pvVar7 = (void *)0x11d7c2;
  fdb_doc_create((fdb_doc **)in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0,
                 (size_t)in_stack_ffffffffffffea98,pvVar8,(size_t)pfVar5,(void *)0x11d7c2,
                 in_stack_ffffffffffffeac0);
  fVar2 = fdb_set((fdb_kvs_handle *)rdoc,pfStack_78);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x11f4);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x11f4,"void invalid_get_byoffset_test()");
    }
  }
  for (last_offset._4_4_ = 0; last_offset._4_4_ < 10; last_offset._4_4_ = last_offset._4_4_ + 1) {
    sprintf(bodybuf + 0xf8,"key%d",(ulong)(last_offset._4_4_ + 1));
    sprintf(local_398,"val%d",(ulong)(last_offset._4_4_ + 1));
    strlen(bodybuf + 0xf8);
    pvVar8 = (void *)0x11d8ee;
    sVar4 = strlen(local_398);
    fdb_doc_create((fdb_doc **)in_stack_ffffffffffffea58,
                   (void *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
                   (size_t)in_stack_ffffffffffffea48,pvVar8,sVar4,(void *)0x11d91f,
                   (size_t)in_stack_ffffffffffffea70);
    fdb_set((fdb_kvs_handle *)rdoc,
            *(fdb_doc **)(&stack0xffffffffffffea48 + (long)last_offset._4_4_ * 8));
  }
  uVar1 = *(uint64_t *)
           (*(long *)(&stack0xffffffffffffea48 + (long)(last_offset._4_4_ + -1) * 8) + 0x30);
  fVar2 = fdb_commit((fdb_file_handle *)in_stack_ffffffffffffea48,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1204);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x1204,"void invalid_get_byoffset_test()");
    }
  }
  for (last_offset._4_4_ = 0; last_offset._4_4_ < 10; last_offset._4_4_ = last_offset._4_4_ + 1) {
    fdb_doc_free((fdb_doc *)0x11da0c);
  }
  pfStack_78->offset = uVar1;
  fVar2 = fdb_get_byoffset(in_stack_ffffffffffffeab8,in_stack_ffffffffffffeab0);
  if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1211);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) {
      __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x1211,"void invalid_get_byoffset_test()");
    }
  }
  fdb_doc_free((fdb_doc *)0x11daa2);
  handle = (fdb_kvs_handle *)(bodybuf + 0xf8);
  strlen(bodybuf + 0xf8);
  pvVar8 = (void *)0x11dadd;
  sVar4 = strlen(local_398);
  fdb_doc_create((fdb_doc **)in_stack_ffffffffffffea58,
                 (void *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
                 (size_t)in_stack_ffffffffffffea48,pvVar8,sVar4,(void *)0x11db0b,
                 (size_t)in_stack_ffffffffffffea70);
  fVar2 = fdb_set((fdb_kvs_handle *)rdoc,pfStack_78);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x121d);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x121d,"void invalid_get_byoffset_test()");
    }
  }
  fVar2 = fdb_del(in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1221);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x1221,"void invalid_get_byoffset_test()");
    }
  }
  fdb_doc_free((fdb_doc *)0x11dbf2);
  sprintf(bodybuf + 0xf8,"key0");
  sprintf(local_398,"body0");
  strlen(bodybuf + 0xf8);
  doc_00 = (fdb_doc *)local_398;
  pvVar8 = (void *)0x11dc57;
  sVar4 = strlen(local_398);
  fdb_doc_create((fdb_doc **)in_stack_ffffffffffffea58,
                 (void *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
                 (size_t)in_stack_ffffffffffffea48,pvVar8,sVar4,(void *)0x11dc85,
                 (size_t)in_stack_ffffffffffffea70);
  fVar2 = fdb_set((fdb_kvs_handle *)rdoc,pfStack_78);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x122b);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x122b,"void invalid_get_byoffset_test()");
    }
  }
  fVar2 = fdb_commit((fdb_file_handle *)in_stack_ffffffffffffea48,'\0');
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x122f);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x122f,"void invalid_get_byoffset_test()");
    }
  }
  fdb_compact((fdb_file_handle *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
              (char *)in_stack_ffffffffffffea48);
  fdb_kvs_close(in_stack_ffffffffffffea48);
  fdb_close((fdb_file_handle *)in_stack_ffffffffffffea48);
  fVar2 = fdb_open((fdb_file_handle **)buf._312_8_,(char *)buf._304_8_,(fdb_config *)buf._296_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x123a);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x123a,"void invalid_get_byoffset_test()");
    }
  }
  fVar2 = fdb_kvs_open((fdb_file_handle *)buf._200_8_,(fdb_kvs_handle **)buf._192_8_,
                       (char *)buf._184_8_,(fdb_kvs_config *)buf._176_8_);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x123c);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x123c,"void invalid_get_byoffset_test()");
    }
  }
  fdb_set_log_callback((fdb_kvs_handle *)rdoc,functional_test_dummy_cb,(void *)0x0);
  fVar2 = fdb_get_byoffset(handle,doc_00);
  if (fVar2 != FDB_RESULT_READ_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1242);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_READ_FAIL) {
      __assert_fail("status == FDB_RESULT_READ_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x1242,"void invalid_get_byoffset_test()");
    }
  }
  __stream = fopen("./dummy2","r");
  i_1 = 0;
  while( true ) {
    iVar3 = fileno(__stream);
    sVar6 = pread(iVar3,&fd,0x1000,i_1);
    if ((sVar6 != 0x1000) || (buf[0xff7] == 0xff)) break;
    i_1 = i_1 + 0x1000;
  }
  fclose(__stream);
  pfStack_78->offset = i_1;
  fVar2 = fdb_get_byoffset(handle,doc_00);
  if (fVar2 != FDB_RESULT_READ_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x126f);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_READ_FAIL) {
      __assert_fail("status == FDB_RESULT_READ_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x126f,"void invalid_get_byoffset_test()");
    }
  }
  iVar3 = rand();
  pfStack_78->offset = i_1 + (long)(iVar3 % 0x1000);
  fVar2 = fdb_get_byoffset(handle,doc_00);
  if (fVar2 != FDB_RESULT_READ_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
            ,0x1277);
    invalid_get_byoffset_test::__test_pass = 0;
    if (fVar2 != FDB_RESULT_READ_FAIL) {
      __assert_fail("status == FDB_RESULT_READ_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                    ,0x1277,"void invalid_get_byoffset_test()");
    }
  }
  fdb_doc_free((fdb_doc *)0x11e09d);
  fdb_begin_transaction(in_stack_ffffffffffffea58,in_stack_ffffffffffffea57);
  for (local_14e0 = 0; local_14e0 < 100; local_14e0 = local_14e0 + 1) {
    sprintf(bodybuf + 0xf8,"k%06d",local_14e0 & 0xffffffff);
    sprintf(local_398,"v%06d",local_14e0 & 0xffffffff);
    fdb_set_kv(pfVar5,pvVar7,in_stack_ffffffffffffea78,in_stack_ffffffffffffea70,
               (size_t)in_stack_ffffffffffffea68);
  }
  fdb_end_transaction(in_stack_ffffffffffffea68,in_stack_ffffffffffffea67);
  for (local_14e0 = 0; local_14e0 < 100000; local_14e0 = local_14e0 + 1) {
    pvVar7 = (void *)0x11e175;
    sprintf(bodybuf + 0xf8,"k%06d",local_14e0 & 0xffffffff);
    fdb_doc_create((fdb_doc **)in_stack_ffffffffffffea58,
                   (void *)CONCAT17(in_stack_ffffffffffffea57,in_stack_ffffffffffffea50),
                   (size_t)in_stack_ffffffffffffea48,pvVar7,0,(void *)0x11e19b,
                   (size_t)in_stack_ffffffffffffea70);
    pfStack_78->offset = local_14e0;
    fdb_get_byoffset(handle,doc_00);
    fdb_doc_free((fdb_doc *)0x11e1c4);
  }
  fdb_kvs_close(in_stack_ffffffffffffea48);
  fdb_close((fdb_file_handle *)in_stack_ffffffffffffea48);
  fdb_shutdown();
  memleak_end();
  if (invalid_get_byoffset_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","invalid get by-offset test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","invalid get by-offset test");
  }
  return;
}

Assistant:

void invalid_get_byoffset_test()
{
    TEST_INIT();
    memleak_start();

    int r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc *rdoc;
    fdb_status status;
    fdb_config fconfig;
    fdb_kvs_config kvs_config;
    char keybuf[256], bodybuf[256];

    r = system(SHELL_DEL " dummy* > errorlog.txt");
    (void)r;

    // open dbfile
    fconfig = fdb_get_default_config();
    fconfig.purging_interval = 1;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_open(&dbfile, "./dummy1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_set_log_callback(db, functional_test_dummy_cb, NULL);

    sprintf(keybuf, "key");
    sprintf(bodybuf, "body");

    /* Scenario 1: Fetch offset from empty file */

    {
        // Create a doc
        fdb_doc_create(&rdoc, keybuf, strlen(keybuf),
                NULL, 0, bodybuf, strlen(bodybuf));
        status = fdb_set(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // close db file
        fdb_kvs_close(db);
        fdb_close(dbfile);

        // open new dbfile
        status = fdb_open(&dbfile, "./dummy1", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_set_log_callback(db, functional_test_dummy_cb, NULL);

        // attempt to get key by previous offset,
        // should fail as doc wasn't commited
        status = fdb_get_byoffset(db, rdoc);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

        fdb_doc_free(rdoc);
    }

    /* Scenario 2: Fetch invalid offset that points to a different data block
       from same file */

    {
        // Create a doc
        fdb_doc_create(&rdoc, keybuf, strlen(keybuf),
                NULL, 0, bodybuf, strlen(bodybuf));
        status = fdb_set(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Write 10 additional documents
        fdb_doc **doc = alca(fdb_doc*, 10);
        int i;
        for (i = 0; i < 10; ++i) {
            sprintf(keybuf, "key%d", i+1);
            sprintf(bodybuf, "val%d", i+1);
            fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
                           NULL, 0, (void*)bodybuf, strlen(bodybuf));
            fdb_set(db, doc[i]);
        }
        uint64_t last_offset = doc[i-1]->offset;

        // Commit the doc so it goes into main index
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Free all the additional documents
        for (i = 0; i < 10; ++i) {
            fdb_doc_free(doc[i]);
        }

        // Incorrectly set rdoc's offset to the last saved doc's offset
        rdoc->offset = last_offset;

        // attempt to get key by incorrect offset belonging to a different
        // data block
        status = fdb_get_byoffset(db, rdoc);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);

        fdb_doc_free(rdoc);
    }

    /* Scenario 3: Fetch old offset from compacted file */

    {
        // Create doc
        fdb_doc_create(&rdoc, keybuf, strlen(keybuf),
                NULL, 0, bodybuf, strlen(bodybuf));
        status = fdb_set(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Delete the doc
        status = fdb_del(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_doc_free(rdoc);
        sprintf(keybuf, "key0");
        sprintf(bodybuf, "body0");

        // Create doc again
        fdb_doc_create(&rdoc, keybuf, strlen(keybuf),
                       NULL, 0, bodybuf, strlen(bodybuf));
        status = fdb_set(db, rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Commit the doc so it goes into main index
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Compact file
        fdb_compact(dbfile, "./dummy2");

        // close db file
        fdb_kvs_close(db);
        fdb_close(dbfile);

        // open new dbfile
        status = fdb_open(&dbfile, "./dummy2", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(dbfile, &db, NULL, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        fdb_set_log_callback(db, functional_test_dummy_cb, NULL);

        // attempt to get key by incorrect offset belonging to different file
        status = fdb_get_byoffset(db, rdoc);
        TEST_CHK(status == FDB_RESULT_READ_FAIL);
    }

    /* Scenario 4: Fetch invalid offset that points to an index block
       on same file */

    {
        uint8_t buf[4096];
        FILE* fd = fopen("./dummy2", "r");
        int64_t offset = 0;
#if !defined(WIN32) && !defined(_WIN32)
        while (pread(fileno(fd), buf, 4096, offset) == 4096) {
            if (buf[4095] == BLK_MARKER_BNODE) {
                // This means this block was an index block
                // (last byte of the block is 0xff)
                break;
            }
            offset += 4096;
        }
        fclose(fd);
#else
        DWORD bytesread;
        OVERLAPPED winoffs;
        memset(&winoffs, 0, sizeof(winoffs));
        winoffs.Offset = offset & 0xFFFFFFFF;
        winoffs.OffsetHigh = ((uint64_t)offset >> 32) & 0x7FFFFFFF;
        while (ReadFile(fd, buf, 4096, &bytesread, &winoffs)) {
            if (buf[4095] == BLK_MARKER_BNODE) {
                // This means this block was an index block
                // (last byte of the block is 0xff)
                break;
            }
            offset += 4096;
            winoffs.Offset = offset & 0xFFFFFFFF;
            winoffs.OffsetHigh = ((uint64_t)offset >> 32) & 0x7FFFFFFF;
        }
        fclose(fd);
#endif

        // Set doc's offset to that of the index block
        rdoc->offset = offset;

        // attempt to get key by incorrect offset belonging to an index block
        // (offset points to start of an index block)
        status = fdb_get_byoffset(db, rdoc);
        TEST_CHK(status == FDB_RESULT_READ_FAIL);

        // Set doc's offset to a random spot within that index block
        rdoc->offset = offset + (rand() % 4096);

        // attempt to get key by incorrect offset belonging to an index block
        // (offset points to somewhere within the index block)
        status = fdb_get_byoffset(db, rdoc);
        TEST_CHK(status == FDB_RESULT_READ_FAIL);

        // Free the document
        fdb_doc_free(rdoc);
    }

    /* Scenario 5: Fetch invalid offset that points to a transaction commit marker
       on same file */
    {
        size_t i;

        // insert 100 docs using transaction
        fdb_begin_transaction(dbfile, FDB_ISOLATION_READ_COMMITTED);
        for (i=0;i<100;++i) {
            sprintf(keybuf, "k%06d", (int)i);
            sprintf(bodybuf, "v%06d", (int)i);
            fdb_set_kv(db, keybuf, 8, bodybuf, 8);
        }
        fdb_end_transaction(dbfile, FDB_COMMIT_NORMAL);

        // try to retrieve all possible offsets
        for (i=0;i<100000;++i) {
            sprintf(keybuf, "k%06d", (int)i);
            fdb_doc_create(&rdoc, NULL, 0 , NULL, 0, NULL, 0);
            rdoc->offset = i;
            fdb_get_byoffset(db, rdoc);
            fdb_doc_free(rdoc);
        }
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("invalid get by-offset test");
}